

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_gen.c
# Opt level: O0

void pk_retrieve_8cols(uchar *cols_out,uint col,uchar *inv,gf *g,gf *L)

{
  byte bVar1;
  uchar *in_RDX;
  long in_RDI;
  int j_1;
  int i;
  int j;
  uchar cols_hat_H [96];
  uchar tmp [768];
  uchar b;
  int local_3a4;
  int local_3a0;
  int local_39c;
  uchar local_398 [16];
  gf *in_stack_fffffffffffffc78;
  gf *in_stack_fffffffffffffc80;
  size_t in_stack_fffffffffffffc88;
  uchar *in_stack_fffffffffffffc90;
  byte local_338 [96];
  byte abStack_2d8 [96];
  byte abStack_278 [96];
  byte abStack_218 [96];
  byte abStack_1b8 [96];
  byte abStack_158 [96];
  byte abStack_f8 [96];
  byte abStack_98 [128];
  uchar *local_18;
  long local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_39c = 0; local_39c < 8; local_39c = local_39c + 1) {
    gen_hat_H_col(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                  in_stack_fffffffffffffc78);
    mat_vec_mul(local_338 + local_39c * 0x60,local_18,0x300,0x300,local_398);
  }
  for (local_3a0 = 0; local_3a0 < 0x60; local_3a0 = local_3a0 + 1) {
    for (local_3a4 = 0; local_3a4 < 8; local_3a4 = local_3a4 + 1) {
      bVar1 = (byte)local_3a4;
      *(byte *)(local_8 + (local_3a0 * 8 + local_3a4)) =
           ((((((((byte)((int)(uint)local_338[local_3a0] >> (bVar1 & 0x1f)) & 1) << 1 |
                (byte)((int)(uint)local_338[local_3a0 + 0x60] >> (bVar1 & 0x1f)) & 1) << 1 |
               (byte)((int)(uint)local_338[local_3a0 + 0xc0] >> (bVar1 & 0x1f)) & 1) << 1 |
              (byte)((int)(uint)local_338[local_3a0 + 0x120] >> (bVar1 & 0x1f)) & 1) << 1 |
             (byte)((int)(uint)local_338[local_3a0 + 0x180] >> (bVar1 & 0x1f)) & 1) << 1 |
            (byte)((int)(uint)local_338[local_3a0 + 0x1e0] >> (bVar1 & 0x1f)) & 1) << 1 |
           (byte)((int)(uint)local_338[local_3a0 + 0x240] >> (bVar1 & 0x1f)) & 1) << 1 |
           (byte)((int)(uint)local_338[local_3a0 + 0x2a0] >> (bVar1 & 0x1f)) & 1;
    }
  }
  return;
}

Assistant:

void pk_retrieve_8cols(unsigned char *cols_out, unsigned int col, unsigned char *inv, gf *g, gf *L)
{
  unsigned char b;
  unsigned char tmp[SYS_T * GFBITS];
  unsigned char cols_hat_H[SYS_T * GFBITS/8];

  // compute 8 columns of \hat{H} and multiply by the inverse to obtain the pubkey columns
  for(int j = 0; j < 8; j++)
  {
    gen_hat_H_col(cols_hat_H, col+j, g, L);
    mat_vec_mul(tmp + (SYS_T*GFBITS/8) * j, inv, SYS_T * GFBITS, SYS_T * GFBITS, cols_hat_H);
  }

  // reassamble the 8 bit columns into the corresponding bytes
  for(int i = 0; i < SYS_T*GFBITS/8; i++)
    for(int j = 0; j < 8; j++)
    {
      b  = (tmp[SYS_T*GFBITS/8 * 0 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 1 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 2 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 3 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 4 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 5 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 6 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 7 + i] >> j) & 1;

      cols_out[i*8 + j] = b;
    }
}